

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateBuildDescriptors
          (FileGenerator *this,Printer *printer)

{
  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
  *this_00;
  undefined8 *puVar1;
  bool bVar2;
  scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator> *psVar3;
  MessageGenerator *pMVar4;
  scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *this_01;
  EnumGenerator *this_02;
  scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator> *this_03;
  ServiceGenerator *this_04;
  scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *this_05;
  ExtensionGenerator *this_06;
  FileDescriptor *pFVar5;
  unsigned_long extraout_RDX;
  unsigned_long i_00;
  unsigned_long extraout_RDX_00;
  int i;
  long lVar6;
  ulong uVar7;
  int i_1;
  long lVar8;
  int i_4;
  pointer pbVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dependency_package_parts;
  string local_160;
  FileDescriptorProto file_proto;
  string local_70;
  string local_50;
  
  pFVar5 = this->file_;
  if (*(int *)(*(long *)(pFVar5 + 0x88) + 0x50) != 3) {
    GlobalAssignDescriptorsName((string *)&file_proto,*(string **)pFVar5);
    io::Printer::Print(printer,"\nvoid $assigndescriptorsname$() {\n","assigndescriptorsname",
                       (string *)&file_proto);
    std::__cxx11::string::~string((string *)&file_proto);
    io::Printer::Indent(printer);
    GlobalAddDescriptorsName((string *)&file_proto,*(string **)this->file_);
    io::Printer::Print(printer,"$adddescriptorsname$();\n","adddescriptorsname",
                       (string *)&file_proto);
    std::__cxx11::string::~string((string *)&file_proto);
    io::Printer::Print(printer,
                       "const ::google::protobuf::FileDescriptor* file =\n  ::google::protobuf::DescriptorPool::generated_pool()->FindFileByName(\n    \"$filename$\");\nGOOGLE_CHECK(file != NULL);\n"
                       ,"filename",*(string **)this->file_);
    for (lVar6 = 0; pFVar5 = this->file_, lVar6 < *(int *)(pFVar5 + 0x48); lVar6 = lVar6 + 1) {
      psVar3 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
               ::operator[](&this->message_generators_,lVar6);
      pMVar4 = internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::operator->
                         (psVar3);
      MessageGenerator::GenerateDescriptorInitializer(pMVar4,printer,(int)lVar6);
    }
    for (lVar6 = 0; lVar6 < *(int *)(pFVar5 + 0x58); lVar6 = lVar6 + 1) {
      this_01 = internal::
                scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>_>
                ::operator[](&this->enum_generators_,lVar6);
      this_02 = internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>::operator->
                          (this_01);
      EnumGenerator::GenerateDescriptorInitializer(this_02,printer,(int)lVar6);
      pFVar5 = this->file_;
    }
    bVar2 = HasGenericServices(pFVar5);
    if (bVar2) {
      for (lVar6 = 0; lVar6 < *(int *)(this->file_ + 0x68); lVar6 = lVar6 + 1) {
        this_03 = internal::
                  scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator>_>
                  ::operator[](&this->service_generators_,lVar6);
        this_04 = internal::scoped_ptr<google::protobuf::compiler::cpp::ServiceGenerator>::
                  operator->(this_03);
        ServiceGenerator::GenerateDescriptorInitializer(this_04,printer,(int)lVar6);
      }
    }
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n\n");
    GlobalAssignDescriptorsName((string *)&file_proto,*(string **)this->file_);
    io::Printer::Print(printer,
                       "namespace {\n\nGOOGLE_PROTOBUF_DECLARE_ONCE(protobuf_AssignDescriptors_once_);\ninline void protobuf_AssignDescriptorsOnce() {\n  ::google::protobuf::GoogleOnceInit(&protobuf_AssignDescriptors_once_,\n                 &$assigndescriptorsname$);\n}\n\n"
                       ,"assigndescriptorsname",(string *)&file_proto);
    std::__cxx11::string::~string((string *)&file_proto);
    io::Printer::Print(printer,
                       "void protobuf_RegisterTypes(const ::std::string&) {\n  protobuf_AssignDescriptorsOnce();\n"
                      );
    io::Printer::Indent(printer);
    for (lVar6 = 0; lVar6 < *(int *)(this->file_ + 0x48); lVar6 = lVar6 + 1) {
      psVar3 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
               ::operator[](&this->message_generators_,lVar6);
      pMVar4 = internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::operator->
                         (psVar3);
      MessageGenerator::GenerateTypeRegistrations(pMVar4,printer);
    }
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n\n}  // namespace\n");
    pFVar5 = this->file_;
  }
  GlobalShutdownFileName((string *)&file_proto,*(string **)pFVar5);
  io::Printer::Print(printer,"\nvoid $shutdownfilename$() {\n","shutdownfilename",
                     (string *)&file_proto);
  std::__cxx11::string::~string((string *)&file_proto);
  io::Printer::Indent(printer);
  this_00 = &this->message_generators_;
  for (lVar6 = 0; lVar6 < *(int *)(this->file_ + 0x48); lVar6 = lVar6 + 1) {
    psVar3 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
             ::operator[](this_00,lVar6);
    pMVar4 = internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::operator->
                       (psVar3);
    MessageGenerator::GenerateShutdownCode(pMVar4,printer);
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  pFVar5 = this->file_;
  GlobalAddDescriptorsName((string *)&file_proto,*(string **)pFVar5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dependency_package_parts,"",(allocator<char> *)&local_160);
  PrintHandlingOptionalStaticInitializers
            (pFVar5,printer,
             "void $adddescriptorsname$() {\n  static bool already_here = false;\n  if (already_here) return;\n  already_here = true;\n  GOOGLE_PROTOBUF_VERIFY_VERSION;\n\n"
             ,"void $adddescriptorsname$_impl() {\n  GOOGLE_PROTOBUF_VERIFY_VERSION;\n\n",
             "adddescriptorsname",(string *)&file_proto,(char *)0x0,
             (string *)&dependency_package_parts);
  std::__cxx11::string::~string((string *)&dependency_package_parts);
  std::__cxx11::string::~string((string *)&file_proto);
  io::Printer::Indent(printer);
  for (lVar6 = 0; pFVar5 = this->file_, lVar6 < *(int *)(pFVar5 + 0x18); lVar6 = lVar6 + 1) {
    puVar1 = *(undefined8 **)(*(long *)(pFVar5 + 0x20) + lVar6 * 8);
    dependency_package_parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    dependency_package_parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    dependency_package_parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    SplitStringUsing((string *)puVar1[1],".",&dependency_package_parts);
    io::Printer::Print(printer,"::");
    lVar8 = 0;
    for (uVar7 = 0;
        uVar7 < (ulong)((long)dependency_package_parts.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)dependency_package_parts.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar7 = uVar7 + 1) {
      io::Printer::Print(printer,"$name$::","name",
                         (string *)
                         ((long)&((dependency_package_parts.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar8));
      lVar8 = lVar8 + 0x20;
    }
    GlobalAddDescriptorsName((string *)&file_proto,(string *)*puVar1);
    io::Printer::Print(printer,"$name$();\n","name",(string *)&file_proto);
    std::__cxx11::string::~string((string *)&file_proto);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&dependency_package_parts);
  }
  if (*(int *)(*(long *)(pFVar5 + 0x88) + 0x50) != 3) {
    FileDescriptorProto::FileDescriptorProto(&file_proto);
    FileDescriptor::CopyTo(this->file_,&file_proto);
    dependency_package_parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&dependency_package_parts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    dependency_package_parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    dependency_package_parts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((ulong)dependency_package_parts.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    MessageLite::SerializeToString((MessageLite *)&file_proto,(string *)&dependency_package_parts);
    io::Printer::Print(printer,"::google::protobuf::DescriptorPool::InternalAddGeneratedFile(");
    i_00 = extraout_RDX;
    for (pbVar9 = (pointer)0x0;
        pbVar9 < dependency_package_parts.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar9 = (pointer)&pbVar9[1]._M_string_length) {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)&dependency_package_parts);
      CEscape(&local_50,&local_70);
      EscapeTrigraphs(&local_160,&local_50);
      io::Printer::Print(printer,"\n  \"$data$\"","data",&local_160);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      i_00 = extraout_RDX_00;
    }
    SimpleItoa_abi_cxx11_
              (&local_160,
               (protobuf *)
               dependency_package_parts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,i_00);
    io::Printer::Print(printer,", $size$);\n","size",&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    io::Printer::Print(printer,
                       "::google::protobuf::MessageFactory::InternalRegisterGeneratedFile(\n  \"$filename$\", &protobuf_RegisterTypes);\n"
                       ,"filename",*(string **)this->file_);
    std::__cxx11::string::~string((string *)&dependency_package_parts);
    FileDescriptorProto::~FileDescriptorProto(&file_proto);
  }
  for (lVar6 = 0; pFVar5 = this->file_, lVar6 < *(int *)(pFVar5 + 0x48); lVar6 = lVar6 + 1) {
    psVar3 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
             ::operator[](this_00,lVar6);
    pMVar4 = internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::operator->
                       (psVar3);
    MessageGenerator::GenerateDefaultInstanceAllocator(pMVar4,printer);
  }
  for (lVar6 = 0; lVar6 < *(int *)(pFVar5 + 0x78); lVar6 = lVar6 + 1) {
    this_05 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>_>
              ::operator[](&this->extension_generators_,lVar6);
    this_06 = internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>::operator->
                        (this_05);
    ExtensionGenerator::GenerateRegistration(this_06,printer);
    pFVar5 = this->file_;
  }
  for (lVar6 = 0; lVar6 < *(int *)(pFVar5 + 0x48); lVar6 = lVar6 + 1) {
    psVar3 = internal::
             scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>_>
             ::operator[](this_00,lVar6);
    pMVar4 = internal::scoped_ptr<google::protobuf::compiler::cpp::MessageGenerator>::operator->
                       (psVar3);
    MessageGenerator::GenerateDefaultInstanceInitializer(pMVar4,printer);
    pFVar5 = this->file_;
  }
  GlobalShutdownFileName((string *)&file_proto,*(string **)pFVar5);
  io::Printer::Print(printer,"::google::protobuf::internal::OnShutdown(&$shutdownfilename$);\n",
                     "shutdownfilename",(string *)&file_proto);
  std::__cxx11::string::~string((string *)&file_proto);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  pFVar5 = this->file_;
  GlobalAddDescriptorsName((string *)&file_proto,*(string **)pFVar5);
  FilenameIdentifier((string *)&dependency_package_parts,*(string **)this->file_);
  PrintHandlingOptionalStaticInitializers
            (pFVar5,printer,
             "// Force AddDescriptors() to be called at static initialization time.\nstruct StaticDescriptorInitializer_$filename$ {\n  StaticDescriptorInitializer_$filename$() {\n    $adddescriptorsname$();\n  }\n} static_descriptor_initializer_$filename$_;\n"
             ,
             "GOOGLE_PROTOBUF_DECLARE_ONCE($adddescriptorsname$_once_);\nvoid $adddescriptorsname$() {\n  ::google::protobuf::::google::protobuf::GoogleOnceInit(&$adddescriptorsname$_once_,\n                 &$adddescriptorsname$_impl);\n}\n"
             ,"adddescriptorsname",(string *)&file_proto,"filename",
             (string *)&dependency_package_parts);
  std::__cxx11::string::~string((string *)&dependency_package_parts);
  std::__cxx11::string::~string((string *)&file_proto);
  return;
}

Assistant:

void FileGenerator::GenerateBuildDescriptors(io::Printer* printer) {
  // AddDescriptors() is a file-level procedure which adds the encoded
  // FileDescriptorProto for this .proto file to the global DescriptorPool for
  // generated files (DescriptorPool::generated_pool()). It either runs at
  // static initialization time (by default) or when default_instance() is
  // called for the first time (in LITE_RUNTIME mode with
  // GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER flag enabled). This procedure also
  // constructs default instances and registers extensions.
  //
  // Its sibling, AssignDescriptors(), actually pulls the compiled
  // FileDescriptor from the DescriptorPool and uses it to populate all of
  // the global variables which store pointers to the descriptor objects.
  // It also constructs the reflection objects.  It is called the first time
  // anyone calls descriptor() or GetReflection() on one of the types defined
  // in the file.

  // In optimize_for = LITE_RUNTIME mode, we don't generate AssignDescriptors()
  // and we only use AddDescriptors() to allocate default instances.
  if (HasDescriptorMethods(file_)) {
    printer->Print(
      "\n"
      "void $assigndescriptorsname$() {\n",
      "assigndescriptorsname", GlobalAssignDescriptorsName(file_->name()));
    printer->Indent();

    // Make sure the file has found its way into the pool.  If a descriptor
    // is requested *during* static init then AddDescriptors() may not have
    // been called yet, so we call it manually.  Note that it's fine if
    // AddDescriptors() is called multiple times.
    printer->Print(
      "$adddescriptorsname$();\n",
      "adddescriptorsname", GlobalAddDescriptorsName(file_->name()));

    // Get the file's descriptor from the pool.
    printer->Print(
      "const ::google::protobuf::FileDescriptor* file =\n"
      "  ::google::protobuf::DescriptorPool::generated_pool()->FindFileByName(\n"
      "    \"$filename$\");\n"
      // Note that this GOOGLE_CHECK is necessary to prevent a warning about "file"
      // being unused when compiling an empty .proto file.
      "GOOGLE_CHECK(file != NULL);\n",
      "filename", file_->name());

    // Go through all the stuff defined in this file and generated code to
    // assign the global descriptor pointers based on the file descriptor.
    for (int i = 0; i < file_->message_type_count(); i++) {
      message_generators_[i]->GenerateDescriptorInitializer(printer, i);
    }
    for (int i = 0; i < file_->enum_type_count(); i++) {
      enum_generators_[i]->GenerateDescriptorInitializer(printer, i);
    }
    if (HasGenericServices(file_)) {
      for (int i = 0; i < file_->service_count(); i++) {
        service_generators_[i]->GenerateDescriptorInitializer(printer, i);
      }
    }

    printer->Outdent();
    printer->Print(
      "}\n"
      "\n");

    // ---------------------------------------------------------------

    // protobuf_AssignDescriptorsOnce():  The first time it is called, calls
    // AssignDescriptors().  All later times, waits for the first call to
    // complete and then returns.
    printer->Print(
      "namespace {\n"
      "\n"
      "GOOGLE_PROTOBUF_DECLARE_ONCE(protobuf_AssignDescriptors_once_);\n"
      "inline void protobuf_AssignDescriptorsOnce() {\n"
      "  ::google::protobuf::GoogleOnceInit(&protobuf_AssignDescriptors_once_,\n"
      "                 &$assigndescriptorsname$);\n"
      "}\n"
      "\n",
      "assigndescriptorsname", GlobalAssignDescriptorsName(file_->name()));

    // protobuf_RegisterTypes():  Calls
    // MessageFactory::InternalRegisterGeneratedType() for each message type.
    printer->Print(
      "void protobuf_RegisterTypes(const ::std::string&) {\n"
      "  protobuf_AssignDescriptorsOnce();\n");
    printer->Indent();

    for (int i = 0; i < file_->message_type_count(); i++) {
      message_generators_[i]->GenerateTypeRegistrations(printer);
    }

    printer->Outdent();
    printer->Print(
      "}\n"
      "\n"
      "}  // namespace\n");
  }

  // -----------------------------------------------------------------

  // ShutdownFile():  Deletes descriptors, default instances, etc. on shutdown.
  printer->Print(
    "\n"
    "void $shutdownfilename$() {\n",
    "shutdownfilename", GlobalShutdownFileName(file_->name()));
  printer->Indent();

  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateShutdownCode(printer);
  }

  printer->Outdent();
  printer->Print(
    "}\n\n");

  // -----------------------------------------------------------------

  // Now generate the AddDescriptors() function.
  PrintHandlingOptionalStaticInitializers(
    file_, printer,
    // With static initializers.
    // Note that we don't need any special synchronization in the following code
    // because it is called at static init time before any threads exist.
    "void $adddescriptorsname$() {\n"
    "  static bool already_here = false;\n"
    "  if (already_here) return;\n"
    "  already_here = true;\n"
    "  GOOGLE_PROTOBUF_VERIFY_VERSION;\n"
    "\n",
    // Without.
    "void $adddescriptorsname$_impl() {\n"
    "  GOOGLE_PROTOBUF_VERIFY_VERSION;\n"
    "\n",
    // Vars.
    "adddescriptorsname", GlobalAddDescriptorsName(file_->name()));

  printer->Indent();

  // Call the AddDescriptors() methods for all of our dependencies, to make
  // sure they get added first.
  for (int i = 0; i < file_->dependency_count(); i++) {
    const FileDescriptor* dependency = file_->dependency(i);
    // Print the namespace prefix for the dependency.
    vector<string> dependency_package_parts;
    SplitStringUsing(dependency->package(), ".", &dependency_package_parts);
    printer->Print("::");
    for (int j = 0; j < dependency_package_parts.size(); j++) {
      printer->Print("$name$::",
                     "name", dependency_package_parts[j]);
    }
    // Call its AddDescriptors function.
    printer->Print(
      "$name$();\n",
      "name", GlobalAddDescriptorsName(dependency->name()));
  }

  if (HasDescriptorMethods(file_)) {
    // Embed the descriptor.  We simply serialize the entire FileDescriptorProto
    // and embed it as a string literal, which is parsed and built into real
    // descriptors at initialization time.
    FileDescriptorProto file_proto;
    file_->CopyTo(&file_proto);
    string file_data;
    file_proto.SerializeToString(&file_data);

    printer->Print(
      "::google::protobuf::DescriptorPool::InternalAddGeneratedFile(");

    // Only write 40 bytes per line.
    static const int kBytesPerLine = 40;
    for (int i = 0; i < file_data.size(); i += kBytesPerLine) {
      printer->Print("\n  \"$data$\"",
                     "data",
                     EscapeTrigraphs(
                         CEscape(file_data.substr(i, kBytesPerLine))));
    }
    printer->Print(
        ", $size$);\n",
      "size", SimpleItoa(file_data.size()));

    // Call MessageFactory::InternalRegisterGeneratedFile().
    printer->Print(
      "::google::protobuf::MessageFactory::InternalRegisterGeneratedFile(\n"
      "  \"$filename$\", &protobuf_RegisterTypes);\n",
      "filename", file_->name());
  }

  // Allocate and initialize default instances.  This can't be done lazily
  // since default instances are returned by simple accessors and are used with
  // extensions.  Speaking of which, we also register extensions at this time.
  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateDefaultInstanceAllocator(printer);
  }
  for (int i = 0; i < file_->extension_count(); i++) {
    extension_generators_[i]->GenerateRegistration(printer);
  }
  for (int i = 0; i < file_->message_type_count(); i++) {
    message_generators_[i]->GenerateDefaultInstanceInitializer(printer);
  }

  printer->Print(
    "::google::protobuf::internal::OnShutdown(&$shutdownfilename$);\n",
    "shutdownfilename", GlobalShutdownFileName(file_->name()));

  printer->Outdent();
  printer->Print(
    "}\n"
    "\n");

  PrintHandlingOptionalStaticInitializers(
    file_, printer,
    // With static initializers.
    "// Force AddDescriptors() to be called at static initialization time.\n"
    "struct StaticDescriptorInitializer_$filename$ {\n"
    "  StaticDescriptorInitializer_$filename$() {\n"
    "    $adddescriptorsname$();\n"
    "  }\n"
    "} static_descriptor_initializer_$filename$_;\n",
    // Without.
    "GOOGLE_PROTOBUF_DECLARE_ONCE($adddescriptorsname$_once_);\n"
    "void $adddescriptorsname$() {\n"
    "  ::google::protobuf::::google::protobuf::GoogleOnceInit(&$adddescriptorsname$_once_,\n"
    "                 &$adddescriptorsname$_impl);\n"
    "}\n",
    // Vars.
    "adddescriptorsname", GlobalAddDescriptorsName(file_->name()),
    "filename", FilenameIdentifier(file_->name()));
}